

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O0

void __thiscall
v_hashmap<substring,_unsigned_long>::double_size(v_hashmap<substring,_unsigned_long> *this)

{
  hash_elem **pphVar1;
  size_t sVar2;
  long in_RDI;
  hash_elem *e_1;
  hash_elem *__end0;
  hash_elem *__begin0;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *__range2;
  hash_elem *e;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> tmp;
  uint64_t in_stack_00000178;
  substring *in_stack_00000180;
  v_hashmap<substring,_unsigned_long> *in_stack_00000188;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *in_stack_00000190;
  hash_elem *in_stack_ffffffffffffff98;
  v_hashmap<substring,_unsigned_long> *in_stack_ffffffffffffffa0;
  v_hashmap<substring,_unsigned_long> *this_00;
  hash_elem *val;
  hash_elem *hash;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *this_01;
  v_hashmap<substring,_unsigned_long> *this_02;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> local_28;
  
  memset(&local_28,0,0x20);
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::resize
            (in_stack_00000190,(size_t)in_stack_00000188);
  pphVar1 = v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::begin
                      ((v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *)(in_RDI + 0x18));
  for (this_02 = (v_hashmap<substring,_unsigned_long> *)*pphVar1;
      this_02 != *(v_hashmap<substring,_unsigned_long> **)(in_RDI + 0x28);
      this_02 = (v_hashmap<substring,_unsigned_long> *)&(this_02->dat).end_array) {
    if (((ulong)this_02->equivalent & 1) != 0) {
      v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::push_back
                ((v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *)
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  base_size(in_stack_ffffffffffffffa0);
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::resize
            (in_stack_00000190,(size_t)in_stack_00000188);
  pphVar1 = v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::begin
                      ((v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *)(in_RDI + 0x18));
  this_00 = (v_hashmap<substring,_unsigned_long> *)*pphVar1;
  sVar2 = base_size(this_00);
  memset(this_00,0,sVar2 * 0x28);
  this_01 = &local_28;
  pphVar1 = v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::begin(this_01);
  hash = *pphVar1;
  pphVar1 = v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::end(this_01);
  val = *pphVar1;
  for (; hash != val; hash = hash + 1) {
    get(in_stack_00000188,in_stack_00000180,in_stack_00000178);
    put_after_get_nogrow(this_02,(substring *)this_01,(uint64_t)hash,(unsigned_long *)val);
  }
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::delete_v
            ((v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *)this_00);
  return;
}

Assistant:

void double_size()
  {  //    printf("doubling size!\n");
    // remember the old occupants
    v_array<hash_elem> tmp = v_array<hash_elem>();
    tmp.resize(num_occupants + 10);
    for (hash_elem* e = dat.begin(); e != dat.end_array; e++)
      if (e->occupied)
        tmp.push_back(*e);

    // double the size and clear
    // std::cerr<<"doubling to "<<(base_size()*2) << " units == " << (base_size()*2*sizeof(hash_elem)) << " bytes / " <<
    // ((size_t)-1)<<std::endl;
    dat.resize(base_size() * 2);
    memset(dat.begin(), 0, base_size() * sizeof(hash_elem));

    // re-insert occupants
    for (auto& e : tmp)
    {
      get(e.key, e.hash);
      //      std::cerr << "reinserting " << e->key << " at " << last_position << std::endl;
      put_after_get_nogrow(e.key, e.hash, e.val);
    }
    tmp.delete_v();
  }